

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiply.cpp
# Opt level: O2

interval_t __thiscall
duckdb::MultiplyOperator::Operation<duckdb::interval_t,long,duckdb::interval_t>
          (MultiplyOperator *this,interval_t left,int64_t right)

{
  int iVar1;
  long lVar2;
  interval_t iVar3;
  
  iVar1 = Cast::Operation<long,int>(left.micros);
  iVar3.months = MultiplyOperatorOverflowCheck::Operation<int,int,int>((int)this,iVar1);
  iVar1 = MultiplyOperatorOverflowCheck::Operation<int,int,int>((int)((ulong)this >> 0x20),iVar1);
  lVar2 = MultiplyOperatorOverflowCheck::Operation<long,long,long>(left._0_8_,left.micros);
  iVar3.days = iVar1;
  iVar3.micros = lVar2;
  return iVar3;
}

Assistant:

interval_t MultiplyOperator::Operation(interval_t left, int64_t right) {
	const auto right32 = Cast::Operation<int64_t, int32_t>(right);
	left.months = MultiplyOperatorOverflowCheck::Operation<int32_t, int32_t, int32_t>(left.months, right32);
	left.days = MultiplyOperatorOverflowCheck::Operation<int32_t, int32_t, int32_t>(left.days, right32);
	left.micros = MultiplyOperatorOverflowCheck::Operation<int64_t, int64_t, int64_t>(left.micros, right);
	return left;
}